

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_path_unmatched_inclusions_next(archive *_a,char **_p)

{
  int iVar1;
  undefined8 *in_RSI;
  match_list *in_RDI;
  wchar_t magic_test;
  wchar_t r;
  void *v;
  archive_match *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else {
    wVar2 = match_list_unmatched_inclusions_next
                      ((archive_match *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (wchar_t)((ulong)in_RSI >> 0x20),&in_RDI->first);
    *in_RSI = local_28;
  }
  return wVar2;
}

Assistant:

int
archive_match_path_unmatched_inclusions_next(struct archive *_a,
    const char **_p)
{
	struct archive_match *a;
	const void *v;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_unmatched_inclusions_next");
	a = (struct archive_match *)_a;

	r = match_list_unmatched_inclusions_next(a, &(a->inclusions), 1, &v);
	*_p = (const char *)v;
	return (r);
}